

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

void pbrt::DisplayDynamic
               (string *title,Point2i *resolution,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *channelNames,
               function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *getTileValues)

{
  Tuple2<pbrt::Point2,_int> in_RCX;
  function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *in_RDX;
  function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *in_RDI;
  lock_guard<std::mutex> lock;
  value_type *in_stack_fffffffffffffee8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff40;
  function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *in_stack_ffffffffffffffc0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd0;
  DisplayItem *in_stack_ffffffffffffffd8;
  Tuple2<pbrt::Point2,_int> resolution_00;
  
  resolution_00 = in_RCX;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RCX,(mutex_type *)in_stack_fffffffffffffee8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)>::function(in_RDI,in_RDX);
  DisplayItem::DisplayItem
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,(Point2i)resolution_00,
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::vector<pbrt::DisplayItem,_std::allocator<pbrt::DisplayItem>_>::push_back
            ((vector<pbrt::DisplayItem,_std::allocator<pbrt::DisplayItem>_> *)in_RCX,
             in_stack_fffffffffffffee8);
  DisplayItem::~DisplayItem((DisplayItem *)in_RCX);
  std::function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)>::~function
            ((function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *)0x5395cb);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_RDI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x5395e2);
  return;
}

Assistant:

void DisplayDynamic(
    const std::string &title, const Point2i &resolution,
    std::vector<std::string> channelNames,
    std::function<void(Bounds2i b, pstd::span<pstd::span<Float>>)> getTileValues) {
    std::lock_guard<std::mutex> lock(mutex);
    dynamicItems.push_back(DisplayItem(title, resolution, channelNames, getTileValues));
}